

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

void __thiscall
cxxopts::OptionDetails::OptionDetails
          (OptionDetails *this,string *short_,string *long_,String *desc,
          shared_ptr<const_cxxopts::Value> *val)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  size_t sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar1 = &(this->m_short).field_2;
  (this->m_short)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (short_->_M_dataplus)._M_p;
  paVar2 = &short_->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&short_->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_short).field_2 + 8) = uVar4;
  }
  else {
    (this->m_short)._M_dataplus._M_p = pcVar3;
    (this->m_short).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_short)._M_string_length = short_->_M_string_length;
  (short_->_M_dataplus)._M_p = (pointer)paVar2;
  short_->_M_string_length = 0;
  (short_->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->m_long).field_2;
  (this->m_long)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (long_->_M_dataplus)._M_p;
  paVar2 = &long_->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&long_->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_long).field_2 + 8) = uVar4;
  }
  else {
    (this->m_long)._M_dataplus._M_p = pcVar3;
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_long)._M_string_length = long_->_M_string_length;
  (long_->_M_dataplus)._M_p = (pointer)paVar2;
  long_->_M_string_length = 0;
  (long_->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->m_desc).field_2;
  (this->m_desc)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (desc->_M_dataplus)._M_p;
  paVar2 = &desc->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&desc->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_desc).field_2 + 8) = uVar4;
  }
  else {
    (this->m_desc)._M_dataplus._M_p = pcVar3;
    (this->m_desc).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_desc)._M_string_length = desc->_M_string_length;
  (desc->_M_dataplus)._M_p = (pointer)paVar2;
  desc->_M_string_length = 0;
  (desc->field_2)._M_local_buf[0] = '\0';
  (this->m_value).super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar5 = (val->super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var6 = (val->super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (val->super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_value).super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar5;
  (this->m_value).super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var6;
  (val->super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  this->m_count = 0;
  this->m_hash = 0;
  std::operator+(&local_50,&this->m_long,&this->m_short);
  sVar7 = std::_Hash_bytes(local_50._M_dataplus._M_p,local_50._M_string_length,0xc70f6907);
  this->m_hash = sVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

OptionDetails
    (
      std::string short_,
      std::string long_,
      String desc,
      std::shared_ptr<const Value> val
    )
    : m_short(std::move(short_))
    , m_long(std::move(long_))
    , m_desc(std::move(desc))
    , m_value(std::move(val))
    , m_count(0)
    {
      m_hash = std::hash<std::string>{}(m_long + m_short);
    }